

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_job_pool.hpp
# Opt level: O1

mmap_disk_job * __thiscall
libtorrent::aux::disk_job_pool<libtorrent::aux::mmap_disk_job>::
allocate_job<libtorrent::aux::job::hash2,std::shared_ptr<libtorrent::aux::mmap_storage>,std::function<void(libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,libtorrent::digest32<256l>const&,libtorrent::storage_error_const&)>,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&,int_const&,libtorrent::digest32<256l>>
          (disk_job_pool<libtorrent::aux::mmap_disk_job> *this,disk_job_flags_t flags,
          shared_ptr<libtorrent::aux::mmap_storage> *stor,
          function<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_const_libtorrent::digest32<256L>_&,_const_libtorrent::storage_error_&)>
          *args,strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *args_1,int *args_2,
          digest32<256L> *args_3)

{
  _Manager_type p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  long lVar3;
  int iVar4;
  mmap_disk_job *pmVar5;
  void *ret;
  _Any_data local_f8;
  _Manager_type local_e8;
  _Invoker_type p_Stack_e0;
  int local_d8;
  int local_d4;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  uchar local_a8;
  undefined1 uStack_a7;
  undefined6 uStack_a6;
  undefined4 uStack_a0;
  uint uStack_9c;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 local_90;
  _Variadic_union<libtorrent::aux::job::read,_libtorrent::aux::job::write,_libtorrent::aux::job::hash,_libtorrent::aux::job::hash2,_libtorrent::aux::job::move_storage,_libtorrent::aux::job::release_files,_libtorrent::aux::job::delete_files,_libtorrent::aux::job::check_fastresume,_libtorrent::aux::job::rename_file,_libtorrent::aux::job::stop_torrent,_libtorrent::aux::job::file_priority,_libtorrent::aux::job::clear_piece,_libtorrent::aux::job::partial_read>
  local_88;
  undefined1 local_38;
  
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->m_job_mutex);
  if (iVar4 == 0) {
    pmVar5 = (mmap_disk_job *)
             (this->m_job_pool).super_pool<libtorrent::aux::allocator_new_delete>.
             super_simple_segregated_storage<unsigned_long>.first;
    if (pmVar5 == (mmap_disk_job *)0x0) {
      pmVar5 = (mmap_disk_job *)
               boost::pool<libtorrent::aux::allocator_new_delete>::ordered_malloc_need_resize
                         (&(this->m_job_pool).super_pool<libtorrent::aux::allocator_new_delete>);
    }
    else {
      (this->m_job_pool).super_pool<libtorrent::aux::allocator_new_delete>.
      super_simple_segregated_storage<unsigned_long>.first =
           (pmVar5->super_disk_job).super_tailqueue_node<libtorrent::aux::disk_job>.next;
    }
    local_b0 = 0;
    uStack_a7 = 0;
    uStack_a0 = 0;
    uStack_9c = uStack_9c & 0xffffff00;
    local_98 = 0x4ee500;
    uStack_94 = 0;
    local_90 = 0xffffff;
    local_e8 = (_Manager_type)0x0;
    local_f8._M_unused._M_object = (void *)0x0;
    local_f8._8_8_ = 0;
    local_88._24_8_ = args->_M_invoker;
    p_Var1 = (args->super__Function_base)._M_manager;
    if (p_Var1 != (_Manager_type)0x0) {
      local_f8._M_unused._0_8_ = (undefined8)*(undefined8 *)&(args->super__Function_base)._M_functor
      ;
      local_f8._8_8_ = *(undefined8 *)((long)&(args->super__Function_base)._M_functor + 8);
      (args->super__Function_base)._M_manager = (_Manager_type)0x0;
      args->_M_invoker = (_Invoker_type)0x0;
      local_e8 = p_Var1;
    }
    local_d8 = args_1->m_val;
    local_d4 = *args_2;
    local_d0 = *(undefined8 *)(args_3->m_number)._M_elems;
    uStack_c8 = *(undefined8 *)((args_3->m_number)._M_elems + 2);
    local_c0 = *(undefined8 *)((args_3->m_number)._M_elems + 4);
    uStack_b8 = *(undefined8 *)((args_3->m_number)._M_elems + 6);
    local_88._0_8_ = 0;
    local_88._8_8_ = 0;
    local_88._16_8_ = (_Manager_type)0x0;
    p_Stack_e0 = (_Invoker_type)local_88._24_8_;
    if (local_e8 != (_Manager_type)0x0) {
      local_88._0_8_ = local_f8._M_unused._M_object;
      local_88._8_8_ = local_f8._8_8_;
      local_88._16_8_ = local_e8;
      local_e8 = (_Manager_type)0x0;
      p_Stack_e0 = (_Invoker_type)0x0;
    }
    local_38 = 3;
    (pmVar5->super_disk_job).super_tailqueue_node<libtorrent::aux::disk_job>.next = (disk_job *)0x0;
    lVar3 = (ulong)uStack_9c << 0x20;
    (pmVar5->super_disk_job).flags = (disk_job_flags_t)(char)(ushort)flags.m_val;
    (pmVar5->super_disk_job).ret = (status_t)(char)((ushort)flags.m_val >> 8);
    *(undefined6 *)&(pmVar5->super_disk_job).field_0xa = uStack_a6;
    (pmVar5->super_disk_job).error.ec.val_ = (int)lVar3;
    (pmVar5->super_disk_job).error.ec.failed_ = (bool)(char)((ulong)lVar3 >> 0x20);
    *(int3 *)&(pmVar5->super_disk_job).error.ec.field_0x5 = (int3)((ulong)lVar3 >> 0x28);
    *(ulong *)&(pmVar5->super_disk_job).error.ec.failed_ = CONCAT44(0x4ee500,uStack_9c);
    *(undefined8 *)((long)&(pmVar5->super_disk_job).error.ec.cat_ + 4) = 0xffffff00000000;
    local_a8 = flags.m_val;
    local_88._32_4_ = local_d8;
    local_88._36_4_ = local_d4;
    local_88._40_8_ = local_d0;
    local_88._48_8_ = uStack_c8;
    local_88._56_8_ = local_c0;
    local_88._64_8_ = uStack_b8;
    ::std::__detail::__variant::
    _Move_ctor_base<false,_libtorrent::aux::job::read,_libtorrent::aux::job::write,_libtorrent::aux::job::hash,_libtorrent::aux::job::hash2,_libtorrent::aux::job::move_storage,_libtorrent::aux::job::release_files,_libtorrent::aux::job::delete_files,_libtorrent::aux::job::check_fastresume,_libtorrent::aux::job::rename_file,_libtorrent::aux::job::stop_torrent,_libtorrent::aux::job::file_priority,_libtorrent::aux::job::clear_piece,_libtorrent::aux::job::partial_read>
    ::_Move_ctor_base((_Move_ctor_base<false,_libtorrent::aux::job::read,_libtorrent::aux::job::write,_libtorrent::aux::job::hash,_libtorrent::aux::job::hash2,_libtorrent::aux::job::move_storage,_libtorrent::aux::job::release_files,_libtorrent::aux::job::delete_files,_libtorrent::aux::job::check_fastresume,_libtorrent::aux::job::rename_file,_libtorrent::aux::job::stop_torrent,_libtorrent::aux::job::file_priority,_libtorrent::aux::job::clear_piece,_libtorrent::aux::job::partial_read>
                       *)&(pmVar5->super_disk_job).action,
                      (_Move_ctor_base<false,_libtorrent::aux::job::read,_libtorrent::aux::job::write,_libtorrent::aux::job::hash,_libtorrent::aux::job::hash2,_libtorrent::aux::job::move_storage,_libtorrent::aux::job::release_files,_libtorrent::aux::job::delete_files,_libtorrent::aux::job::check_fastresume,_libtorrent::aux::job::rename_file,_libtorrent::aux::job::stop_torrent,_libtorrent::aux::job::file_priority,_libtorrent::aux::job::clear_piece,_libtorrent::aux::job::partial_read>
                       *)&local_88._M_first);
    (pmVar5->storage).super___shared_ptr<libtorrent::aux::mmap_storage,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (stor->super___shared_ptr<libtorrent::aux::mmap_storage,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    (pmVar5->storage).super___shared_ptr<libtorrent::aux::mmap_storage,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var2 = (stor->super___shared_ptr<libtorrent::aux::mmap_storage,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    (stor->super___shared_ptr<libtorrent::aux::mmap_storage,_(__gnu_cxx::_Lock_policy)2>).
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (pmVar5->storage).super___shared_ptr<libtorrent::aux::mmap_storage,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var2;
    (stor->super___shared_ptr<libtorrent::aux::mmap_storage,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)0x0;
    ::std::__detail::__variant::
    _Variant_storage<false,_libtorrent::aux::job::read,_libtorrent::aux::job::write,_libtorrent::aux::job::hash,_libtorrent::aux::job::hash2,_libtorrent::aux::job::move_storage,_libtorrent::aux::job::release_files,_libtorrent::aux::job::delete_files,_libtorrent::aux::job::check_fastresume,_libtorrent::aux::job::rename_file,_libtorrent::aux::job::stop_torrent,_libtorrent::aux::job::file_priority,_libtorrent::aux::job::clear_piece,_libtorrent::aux::job::partial_read>
    ::~_Variant_storage((_Variant_storage<false,_libtorrent::aux::job::read,_libtorrent::aux::job::write,_libtorrent::aux::job::hash,_libtorrent::aux::job::hash2,_libtorrent::aux::job::move_storage,_libtorrent::aux::job::release_files,_libtorrent::aux::job::delete_files,_libtorrent::aux::job::check_fastresume,_libtorrent::aux::job::rename_file,_libtorrent::aux::job::stop_torrent,_libtorrent::aux::job::file_priority,_libtorrent::aux::job::clear_piece,_libtorrent::aux::job::partial_read>
                         *)&local_88._M_first);
    if (local_e8 != (_Manager_type)0x0) {
      (*local_e8)(&local_f8,&local_f8,__destroy_functor);
    }
    (this->m_job_pool).super_pool<libtorrent::aux::allocator_new_delete>.start_size = 100;
    (this->m_job_pool).super_pool<libtorrent::aux::allocator_new_delete>.next_size = 100;
    this->m_jobs_in_use = this->m_jobs_in_use + 1;
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_job_mutex);
    return pmVar5;
  }
  ::std::__throw_system_error(iVar4);
}

Assistant:

T* allocate_job(
			disk_job_flags_t const flags
			, Storage stor
			, Args&&... args)
		{
			std::lock_guard<std::mutex> l(m_job_mutex);
			auto* ptr = m_job_pool.malloc();
			new (ptr) T{
				disk_job{
				tailqueue_node<disk_job>{},
				flags,
				status_t{},
				storage_error{},
				JobType{std::forward<Args>(args)...},
#if TORRENT_USE_ASSERTS
				true, // in_use
				false, // job_posted
				false, // callback_called
				false, // blocked
#endif
				},
				std::move(stor)};
			m_job_pool.set_next_size(100);
			++m_jobs_in_use;
			if constexpr (std::is_same_v<JobType, job::read>)
				++m_read_jobs;
			else if constexpr (std::is_same_v<JobType, job::write>)
				++m_write_jobs;

			return ptr;
		}